

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_writer_init_filename(mpack_writer_t *writer,char *filename)

{
  FILE *file;
  
  file = fopen(filename,"wb");
  if (file != (FILE *)0x0) {
    mpack_writer_init_stdfile(writer,(FILE *)file,true);
    return;
  }
  writer->version = mpack_version_current;
  writer->flush = (mpack_writer_flush_t)0x0;
  writer->error_fn = (mpack_writer_error_t)0x0;
  writer->teardown = (mpack_writer_teardown_t)0x0;
  writer->context = (void *)0x0;
  writer->buffer = (char *)0x0;
  writer->current = (char *)0x0;
  writer->end = (char *)0x0;
  writer->error = mpack_error_io;
  return;
}

Assistant:

void mpack_writer_init_filename(mpack_writer_t* writer, const char* filename) {
    mpack_assert(filename != NULL, "filename is NULL");

    FILE* file = fopen(filename, "wb");
    if (file == NULL) {
        mpack_writer_init_error(writer, mpack_error_io);
        return;
    }

    mpack_writer_init_stdfile(writer, file, true);
}